

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

Transaction * __thiscall
cfd::core::Psbt::GetTxInUtxoFull
          (Transaction *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool *is_witness)

{
  CfdException *this_00;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_70;
  ByteData local_48;
  void *local_30;
  wally_psbt *psbt_pointer;
  bool *is_witness_local;
  bool ignore_error_local;
  Psbt *pPStack_18;
  uint32_t index_local;
  Psbt *this_local;
  
  psbt_pointer = (wally_psbt *)is_witness;
  is_witness_local._3_1_ = ignore_error;
  is_witness_local._4_4_ = index;
  pPStack_18 = this;
  this_local = (Psbt *)__return_storage_ptr__;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x9fe,"GetTxInUtxoFull");
  local_30 = this->wally_psbt_pointer_;
  if (*(long *)(*(long *)((long)local_30 + 0x10) + (ulong)is_witness_local._4_4_ * 0x110) == 0) {
    if ((is_witness_local._3_1_ & 1) == 0) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0xa0b;
      local_70.funcname = "GetTxInUtxoFull";
      logger::warn<>(&local_70,"utxo full data not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_90,"psbt utxo full data not found error.",&local_91);
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_90);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Transaction::Transaction(__return_storage_ptr__);
  }
  else {
    if (psbt_pointer != (wally_psbt *)0x0) {
      psbt_pointer->magic[0] =
           *(long *)(*(long *)((long)local_30 + 0x10) + (ulong)is_witness_local._4_4_ * 0x110 + 8)
           != 0;
    }
    ConvertBitcoinTxFromWally
              (&local_48,
               *(wally_tx **)
                (*(long *)((long)local_30 + 0x10) + (ulong)is_witness_local._4_4_ * 0x110),false);
    Transaction::Transaction(__return_storage_ptr__,&local_48);
    ByteData::~ByteData(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Transaction Psbt::GetTxInUtxoFull(
    uint32_t index, bool ignore_error, bool *is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (is_witness != nullptr) {
      *is_witness = (psbt_pointer->inputs[index].witness_utxo != nullptr);
    }
    return Transaction(
        ConvertBitcoinTxFromWally(psbt_pointer->inputs[index].utxo, false));
  } else if (ignore_error) {
    return Transaction();
  } else {
    warn(CFD_LOG_SOURCE, "utxo full data not found.");
    throw CfdException(
        kCfdIllegalStateError, "psbt utxo full data not found error.");
  }
}